

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

int readDisplacement(InternalInstruction *insn)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint offset;
  long lVar5;
  bool bVar6;
  uint8_t byte;
  uint8_t byte_1;
  undefined8 uStack_38;
  
  iVar1 = 0;
  if (insn->consumedDisplacement != false) {
    return 0;
  }
  uStack_38 = 0;
  insn->consumedDisplacement = true;
  insn->displacementOffset = (char)(int)insn->readerCursor - (char)(int)insn->startLocation;
  switch(insn->eaDisplacement) {
  case EA_DISP_NONE:
    insn->consumedDisplacement = false;
    return 0;
  case EA_DISP_8:
    bVar6 = true;
    bVar3 = 0;
    do {
      bVar2 = bVar3;
      if (!bVar6) {
        insn->readerCursor = insn->readerCursor + 1;
        goto LAB_0022cfb9;
      }
      iVar1 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 5),
                              insn->readerCursor);
      bVar6 = false;
      if (iVar1 == 0) {
        bVar3 = uStack_38._5_1_;
      }
      else {
        bVar3 = 0;
      }
      bVar3 = bVar3 | bVar2;
    } while (iVar1 == 0);
    if (iVar1 != 0) {
      return -1;
    }
LAB_0022cfb9:
    insn->displacement = (long)(char)bVar2;
    goto LAB_0022cfc1;
  case EA_DISP_16:
    bVar3 = 0;
    lVar5 = 0;
    uVar4 = 0;
    do {
      iVar1 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 6),
                              insn->readerCursor + lVar5);
      if (iVar1 != 0) goto LAB_0022cf9e;
      uVar4 = uVar4 | (uint)uStack_38._6_1_ << (bVar3 & 0x3f);
      lVar5 = lVar5 + 1;
      bVar3 = bVar3 + 8;
    } while (lVar5 == 1);
    insn->readerCursor = insn->readerCursor + 2;
    lVar5 = (long)(short)uVar4;
    break;
  case EA_DISP_32:
    bVar3 = 0;
    lVar5 = 0;
    uVar4 = 0;
    do {
      iVar1 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 7),
                              insn->readerCursor + lVar5);
      if (iVar1 != 0) goto LAB_0022cf9e;
      uVar4 = uVar4 | (uint)uStack_38._7_1_ << (bVar3 & 0x3f);
      lVar5 = lVar5 + 1;
      bVar3 = bVar3 + 8;
    } while (lVar5 != 4);
    insn->readerCursor = insn->readerCursor + 4;
    lVar5 = (long)(int)uVar4;
    break;
  default:
    goto switchD_0022ce8b_default;
  }
  bVar6 = true;
LAB_0022cfa3:
  iVar1 = -1;
  if (bVar6) {
    insn->displacement = lVar5;
LAB_0022cfc1:
    iVar1 = 0;
  }
switchD_0022ce8b_default:
  return iVar1;
LAB_0022cf9e:
  bVar6 = iVar1 == 0;
  lVar5 = 0;
  goto LAB_0022cfa3;
}

Assistant:

static int readDisplacement(struct InternalInstruction *insn)
{
	int8_t d8;
	int16_t d16;
	int32_t d32;

	// dbgprintf(insn, "readDisplacement()");

	if (insn->consumedDisplacement)
		return 0;

	insn->consumedDisplacement = true;
	insn->displacementOffset = (uint8_t)(insn->readerCursor - insn->startLocation);

	switch (insn->eaDisplacement) {
		case EA_DISP_NONE:
			insn->consumedDisplacement = false;
			break;
		case EA_DISP_8:
			if (consumeInt8(insn, &d8))
				return -1;
			insn->displacement = d8;
			break;
		case EA_DISP_16:
			if (consumeInt16(insn, &d16))
				return -1;
			insn->displacement = d16;
			break;
		case EA_DISP_32:
			if (consumeInt32(insn, &d32))
				return -1;
			insn->displacement = d32;
			break;
	}

	return 0;
}